

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetUsageString(USAGE Usage)

{
  int iVar1;
  Char *pCVar2;
  USAGE Usage_local;
  
  if (GetUsageString(Diligent::USAGE)::UsageStrings == '\0') {
    iVar1 = __cxa_guard_acquire(&GetUsageString(Diligent::USAGE)::UsageStrings);
    if (iVar1 != 0) {
      GetUsageString::UsageToStringMap::UsageToStringMap(&GetUsageString::UsageStrings);
      __cxa_guard_release(&GetUsageString(Diligent::USAGE)::UsageStrings);
    }
  }
  pCVar2 = GetUsageString(Diligent::USAGE)::UsageToStringMap::operator[](Diligent::USAGE__const
                     (&GetUsageString::UsageStrings,Usage);
  return pCVar2;
}

Assistant:

const Char* GetUsageString(USAGE Usage)
{
    struct UsageToStringMap
    {
        UsageToStringMap()
        {
#define INIT_USAGE_STR(Usage) UsageStrings[Usage] = #Usage
            INIT_USAGE_STR(USAGE_IMMUTABLE);
            INIT_USAGE_STR(USAGE_DEFAULT);
            INIT_USAGE_STR(USAGE_DYNAMIC);
            INIT_USAGE_STR(USAGE_STAGING);
            INIT_USAGE_STR(USAGE_UNIFIED);
            INIT_USAGE_STR(USAGE_SPARSE);
#undef INIT_USAGE_STR
            static_assert(USAGE_NUM_USAGES == 6, "Please update the map to handle the new usage type");
        }

        const Char* operator[](USAGE Usage) const
        {
            if (Usage >= USAGE_IMMUTABLE && Usage < USAGE_NUM_USAGES)
                return UsageStrings[Usage];
            else
            {
                UNEXPECTED("Unknown usage");
                return "Unknown usage";
            }
        }

    private:
        std::array<const Char*, USAGE_NUM_USAGES> UsageStrings{};
    };

    static const UsageToStringMap UsageStrings;
    return UsageStrings[Usage];
}